

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::commitContrast(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  
  MVar1 = mmal_port_parameter_set_rational
                    (((this->State).camera_component)->control,0x1002d,
                     (MMAL_RATIONAL_T)((ulong)(uint)(this->State).contrast | 0x6400000000));
  if (MVar1 != MMAL_SUCCESS) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"commitContrast",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set contrast parameter.\n",0x24);
    return;
  }
  return;
}

Assistant:

void Private_Impl::commitContrast() {
            if ( mmal_port_parameter_set_rational ( State.camera_component->control, MMAL_PARAMETER_CONTRAST, ( MMAL_RATIONAL_T ) {
            State.contrast, 100
        } ) != MMAL_SUCCESS )
            cout << __func__ << ": Failed to set contrast parameter.\n";
        }